

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O1

Model * addOptionalField(Model *model,string *name)

{
  int iVar1;
  ulong uVar2;
  Rep *pRVar3;
  ModelDescription *pMVar4;
  FeatureDescription *obj;
  void *pvVar5;
  FeatureType *pFVar6;
  Int64FeatureType *pIVar7;
  undefined8 *puVar8;
  Arena *pAVar9;
  
  if (model->description_ == (ModelDescription *)0x0) {
    uVar2 = (model->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar9);
    model->description_ = pMVar4;
  }
  pMVar4 = model->description_;
  pRVar3 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar5 = pRVar3->elements[iVar1];
      goto LAB_0016757d;
    }
  }
  obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                  ((pMVar4->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar4->input_).super_RepeatedPtrFieldBase,obj);
LAB_0016757d:
  puVar8 = (undefined8 *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)((long)pvVar5 + 0x10),name,puVar8);
  if (*(long *)((long)pvVar5 + 0x20) == 0) {
    pAVar9 = (Arena *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar9)
    ;
    *(FeatureType **)((long)pvVar5 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar5 + 0x20);
  if (pFVar6->_oneof_case_[0] != 1) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 1;
    uVar2 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pIVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                       (pAVar9);
    (pFVar6->Type_).int64type_ = pIVar7;
  }
  if (*(long *)((long)pvVar5 + 0x20) == 0) {
    pAVar9 = (Arena *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar9)
    ;
    *(FeatureType **)((long)pvVar5 + 0x20) = pFVar6;
  }
  *(undefined1 *)(*(long *)((long)pvVar5 + 0x20) + 0x10) = 1;
  return model;
}

Assistant:

static Specification::Model& addOptionalField(Specification::Model& model, const std::string& name) {
    auto *input = model.mutable_description()->add_input();
    input->set_name(name);
    input->mutable_type()->mutable_int64type();
    input->mutable_type()->set_isoptional(true);
    return model;
}